

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O1

void nhdp_db_neighbor_join(nhdp_neighbor *dst,nhdp_neighbor *src)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  list_entity **pplVar4;
  list_entity *plVar5;
  list_entity *plVar6;
  
  if (dst != src) {
    dst->symmetric = dst->symmetric + src->symmetric;
    plVar5 = (src->_links).next;
    if (plVar5->prev != (src->_links).prev) {
      do {
        pplVar4 = &plVar5->prev;
        plVar1 = plVar5->next;
        plVar3 = (plVar5[-7].next)->prev;
        plVar6 = plVar5[-7].next;
        while (plVar3 != plVar5[-7].prev) {
          plVar2 = plVar6->next;
          avl_remove(&src->_link_addresses,plVar6);
          avl_insert(&dst->_link_addresses,plVar6);
          plVar6 = plVar2;
          plVar3 = plVar2->prev;
        }
        if ((src->originator)._type != '\0') {
          avl_remove(plVar5[-0xc].next + 0x1f,plVar5 + 1);
        }
        plVar5[3].prev = (list_entity *)dst;
        if ((dst->originator)._type != '\0') {
          avl_insert(plVar5[-0xc].next + 0x1f,plVar5 + 1);
        }
        plVar3 = *pplVar4;
        plVar6 = plVar5->next;
        plVar3->next = plVar6;
        plVar6->prev = plVar3;
        *pplVar4 = (list_entity *)0x0;
        plVar5->next = (list_entity *)0x0;
        plVar3 = (dst->_links).prev;
        plVar5->next = &dst->_links;
        *pplVar4 = plVar3;
        (dst->_links).prev = plVar5;
        plVar3->next = plVar5;
        plVar5[-0xb].next = (list_entity *)dst;
        plVar5 = plVar1;
      } while (plVar1->prev != (src->_links).prev);
    }
    plVar5 = (src->_neigh_addresses).list_head.next;
    if (plVar5->prev != (src->_neigh_addresses).list_head.prev) {
      do {
        plVar1 = plVar5->next;
        avl_remove(&src->_neigh_addresses,plVar5);
        avl_insert(&dst->_neigh_addresses,plVar5);
        plVar5[-7].next = (list_entity *)dst;
        plVar5 = plVar1;
      } while (plVar1->prev != (src->_neigh_addresses).list_head.prev);
    }
    nhdp_db_neighbor_remove(src);
    return;
  }
  return;
}

Assistant:

void
nhdp_db_neighbor_join(struct nhdp_neighbor *dst, struct nhdp_neighbor *src) {
  struct nhdp_naddr *naddr, *na_it;
  struct nhdp_link *lnk, *l_it;
  struct nhdp_laddr *laddr, *la_it;

  if (dst == src) {
    return;
  }

  /* fix symmetric link count */
  dst->symmetric += src->symmetric;

  /* move links */
  list_for_each_element_safe(&src->_links, lnk, _neigh_node, l_it) {
    /* more addresses to new neighbor */
    avl_for_each_element_safe(&lnk->_addresses, laddr, _neigh_node, la_it) {
      avl_remove(&src->_link_addresses, &laddr->_neigh_node);
      avl_insert(&dst->_link_addresses, &laddr->_neigh_node);
    }

    /* move interface based originator */
    if (netaddr_get_address_family(&src->originator) != AF_UNSPEC) {
      avl_remove(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }
    lnk->_originator_node.key = &dst->originator;
    if (netaddr_get_address_family(&dst->originator) != AF_UNSPEC) {
      avl_insert(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }

    /* move link to new neighbor */
    list_remove(&lnk->_neigh_node);
    list_add_tail(&dst->_links, &lnk->_neigh_node);
    lnk->neigh = dst;
  }

  /* move neighbor addresses to target */
  avl_for_each_element_safe(&src->_neigh_addresses, naddr, _neigh_node, na_it) {
    /* move address to new neighbor */
    avl_remove(&src->_neigh_addresses, &naddr->_neigh_node);
    avl_insert(&dst->_neigh_addresses, &naddr->_neigh_node);
    naddr->neigh = dst;
  }

  nhdp_db_neighbor_remove(src);
}